

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

vm_obj_id_t __thiscall CVmObjLookupTable::create_copy(CVmObjLookupTable *this)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  vm_obj_id_t obj_id;
  int iVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  vm_lookup_ext *this_00;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  puVar5 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar5 = &PTR_get_metaclass_reg_00309868;
  puVar5[1] = 0;
  puVar3 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(ulong)uVar2 * 0x28 + (ulong)(uVar1 - 1) * 8 + 0x28,puVar5);
  this_00 = (vm_lookup_ext *)CONCAT44(extraout_var,iVar4);
  this_00->bucket_cnt = uVar1;
  this_00->value_cnt = uVar2;
  (this_00->default_value).typ = VM_NIL;
  puVar5[1] = this_00;
  vm_lookup_ext::copy_ext_from
            (this_00,(vm_lookup_ext *)(this->super_CVmObjCollection).super_CVmObject.ext_);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create_copy(VMG0_)
{
    vm_obj_id_t id;
    CVmObjLookupTable *new_obj;
    
    /* allocate the object ID */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* allocate a new object */
    new_obj = new (vmg_ id) CVmObjLookupTable();

    /* 
     *   set up the new object with our same sizes, but don't initialize it
     *   - we're going to blast all of our data directly into the new
     *   extension, so we don't need to waste time setting up an empty
     *   initial state 
     */
    new_obj->ext_ = (char *)vm_lookup_ext::alloc_ext(
        vmg_ new_obj, get_bucket_count(), get_entry_count());

    /* copy my data to the next object */
    new_obj->get_ext()->copy_ext_from(get_ext());

    /* return the new object's id */
    return id;
}